

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_proptype
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  vm_val_t *in_RDX;
  undefined4 in_ESI;
  vm_val_t *in_RDI;
  vm_obj_id_t source_obj;
  vm_prop_id_t prop;
  vm_val_t val;
  CVmRun *in_stack_ffffffffffffffa0;
  vm_val_t *in_stack_ffffffffffffffa8;
  undefined1 local_50 [6];
  undefined2 local_4a;
  int local_48 [2];
  undefined2 local_40;
  vm_val_t *local_20;
  undefined4 local_14;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_proptype::desc,1);
    __cxa_guard_release(&getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_stack_ffffffffffffffa8,(uint *)in_stack_ffffffffffffffa0,
                              (CVmNativeCodeDesc *)in_RDI);
  if (iVar1 == 0) {
    CVmRun::pop_prop(in_stack_ffffffffffffffa0,in_RDI);
    local_4a = local_40;
    iVar1 = (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,local_40,local_48,local_14,local_50,0);
    if (iVar1 == 0) {
      vm_val_t::set_nil(local_20);
    }
    else {
      if (local_48[0] == 0x11) {
        iVar1 = CVmObjAnonFn::is_anonfn_obj(0);
        if ((iVar1 == 0) && (iVar1 = CVmDynamicFunc::is_dynfunc_obj(0), iVar1 == 0)) {
          iVar1 = CVmObjString::is_string_obj(0);
          if (iVar1 == 0) {
            local_48[0] = 5;
          }
          else {
            local_48[0] = 9;
          }
        }
        else {
          local_48[0] = 0xb;
        }
      }
      else if (local_48[0] == 0x12) {
        local_48[0] = 0x10;
      }
      vm_val_t::set_datatype((vm_val_t *)in_stack_ffffffffffffffa0,in_RDI);
    }
  }
  return 1;
}

Assistant:

int CVmObject::getp_proptype(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc,
                             vm_prop_id_t, vm_obj_id_t *)
{
    vm_val_t val;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* get the property value */
    if (!get_prop(vmg_ prop, &val, self, &source_obj, 0))
    {
        /* the property isn't defined on the object - the result is nil */
        retval->set_nil();
    }
    else
    {
        /* 
         *   Fix up OBJX (execute-on-eval object reference) and BIFPTRX
         *   (execute-on-eval built-in function pointer) values to reflect
         *   the underlying datatype.  Treat an anonymous function or dynamic
         *   function as a CODEOFS value; treat a string object as a DSTRING
         *   value.  
         */
        if (val.typ == VM_OBJX)
        {
            if (CVmObjAnonFn::is_anonfn_obj(vmg_ val.val.obj)
                || CVmDynamicFunc::is_dynfunc_obj(vmg_ val.val.obj))
                val.typ = VM_CODEOFS;
            else if (CVmObjString::is_string_obj(vmg_ val.val.obj))
                val.typ = VM_DSTRING;
            else
                val.typ = VM_OBJ;
        }
        else if (val.typ == VM_BIFPTRX)
            val.typ = VM_BIFPTR;

        /* set the return value to the property's datatype value */
        retval->set_datatype(vmg_ &val);
    }

    /* handled */
    return TRUE;
}